

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::QFileDialog(QFileDialog *this,QFileDialogArgs *args)

{
  QFileDialogPrivate *pQVar1;
  QWidget *in_RSI;
  QDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *unaff_retaddr;
  QFileDialogPrivate *d;
  Options in_stack_0000004c;
  QDialogPrivate *dd;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  undefined4 uVar3;
  QFileDialog *this_00;
  
  this_00 = *(QFileDialog **)(in_FS_OFFSET + 0x28);
  dd = in_RDI;
  pQVar1 = (QFileDialogPrivate *)operator_new(0x438);
  QFileDialogPrivate::QFileDialogPrivate(pQVar1);
  uVar3 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x74d200);
  QDialog::QDialog((QDialog *)CONCAT44(uVar3,in_stack_fffffffffffffff0),dd,in_RSI,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)this_00 >> 0x20,0));
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR_metaObject_00d22758;
  *(undefined ***)&(in_RDI->super_QWidgetPrivate).field_0x10 = &PTR__QFileDialog_00d22930;
  pQVar1 = d_func((QFileDialog *)0x74d23d);
  QFileDialogPrivate::init(pQVar1,(EVP_PKEY_CTX *)in_RSI);
  setFileMode(unaff_retaddr,(FileMode)((ulong)this_00 >> 0x20));
  uVar2 = *(undefined4 *)&in_RSI[2].field_0xc;
  setOptions((QFileDialog *)dd,in_stack_0000004c);
  selectFile(this_00,(QString *)CONCAT44(uVar3,uVar2));
  if (*(QFileDialog **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFileDialog::QFileDialog(const QFileDialogArgs &args)
    : QDialog(*new QFileDialogPrivate, args.parent, { })
{
    Q_D(QFileDialog);
    d->init(args);
    setFileMode(args.mode);
    setOptions(args.options);
    selectFile(args.selection);
}